

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::InitExtensions
          (LocalSingleBlockLoadStoreElimPass *this)

{
  __hashtable *__h;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar1;
  long *plVar2;
  __node_gen_type __node_gen;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_828;
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = &this->extensions_allowlist_;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&this_00->_M_h);
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_820,"SPV_AMD_shader_explicit_vertex_parameter","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_800,"SPV_AMD_shader_trinary_minmax","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"SPV_AMD_gcn_shader","");
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"SPV_KHR_shader_ballot","");
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a0,"SPV_AMD_shader_ballot","");
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"SPV_AMDX_shader_enqueue","");
  local_760[0] = local_750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_760,"SPV_AMD_gpu_shader_half_float","");
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,"SPV_KHR_shader_draw_parameters","");
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"SPV_KHR_subgroup_vote","");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"SPV_KHR_8bit_storage","");
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"SPV_KHR_16bit_storage","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"SPV_KHR_device_group","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"SPV_KHR_multiview","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_680,"SPV_NVX_multiview_per_view_attributes","");
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"SPV_NV_viewport_array2","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,"SPV_NV_stereo_view_rendering","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,"SPV_NV_sample_mask_override_coverage","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,"SPV_NV_geometry_shader_passthrough","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,"SPV_AMD_texture_gather_bias_lod","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,"SPV_KHR_storage_buffer_storage_class","");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a0,"SPV_KHR_variable_pointers","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"SPV_AMD_gpu_shader_int16","")
  ;
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_560,"SPV_KHR_post_depth_coverage","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_540,"SPV_KHR_shader_atomic_counter_ops","");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,"SPV_EXT_shader_stencil_export","");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"SPV_EXT_shader_viewport_index_layer","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e0,"SPV_AMD_shader_image_load_store_lod","");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,"SPV_AMD_shader_fragment_mask","");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a0,"SPV_EXT_fragment_fully_covered","");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_480,"SPV_AMD_gpu_shader_half_float_fetch","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_460,"SPV_GOOGLE_decorate_string","");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_440,"SPV_GOOGLE_hlsl_functionality1","");
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"SPV_GOOGLE_user_type","");
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_400,"SPV_NV_shader_subgroup_partitioned","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,"SPV_EXT_demote_to_helper_invocation","");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,"SPV_EXT_descriptor_indexing","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,"SPV_NV_fragment_shader_barycentric","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"SPV_NV_compute_shader_derivatives","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"SPV_NV_shader_image_footprint","");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"SPV_NV_shading_rate","");
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"SPV_NV_mesh_shader","");
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"SPV_EXT_mesh_shader","");
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"SPV_NV_ray_tracing","");
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"SPV_KHR_ray_tracing","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"SPV_KHR_ray_query","");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,"SPV_EXT_fragment_invocation_density","");
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,"SPV_EXT_physical_storage_buffer","");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,"SPV_KHR_physical_storage_buffer","");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"SPV_KHR_terminate_invocation","");
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"SPV_KHR_subgroup_uniform_control_flow","");
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,"SPV_KHR_integer_dot_product","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"SPV_EXT_shader_image_int64","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"SPV_KHR_non_semantic_info","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"SPV_KHR_uniform_group_instructions","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"SPV_KHR_fragment_shader_barycentric","");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"SPV_KHR_vulkan_memory_model","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"SPV_NV_bindless_texture","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"SPV_EXT_shader_atomic_float_add","");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"SPV_EXT_fragment_shader_interlock","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"SPV_KHR_compute_shader_derivatives","");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"SPV_NV_cooperative_matrix","")
  ;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"SPV_KHR_cooperative_matrix","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"SPV_KHR_ray_tracing_position_fetch","");
  plVar2 = local_30;
  local_40[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"SPV_KHR_fragment_shading_rate","");
  lVar1 = 0;
  local_828 = &this_00->_M_h;
  do {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,(long)local_820 + lVar1,&local_828);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x800);
  lVar1 = -0x800;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

void LocalSingleBlockLoadStoreElimPass::InitExtensions() {
  extensions_allowlist_.clear();
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMDX_shader_enqueue",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_GOOGLE_user_type",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_demote_to_helper_invocation",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_KHR_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch",
                                "SPV_KHR_fragment_shading_rate"});
}